

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestJson.cpp
# Opt level: O0

void testStripComments(void)

{
  usize *this;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined1 local_90 [8];
  String check;
  undefined1 local_58 [8];
  String stripped;
  String input;
  
  this = &stripped._data.ref;
  String::String<40ul>
            ((String *)this,(char (*) [40])"{\n  \"test\": \"/*\",\n  /*\n*/\n  //\n  //a\n}\n");
  Json::stripComments((String *)local_58,(String *)this);
  String::String<31ul>
            ((String *)local_90,(char (*) [31])"{\n  \"test\": \"/*\",\n  \n\n  \n  \n}\n");
  bVar2 = String::operator==((String *)local_58,(String *)local_90);
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x34,"stripped == check");
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  String::~String((String *)local_90);
  String::~String((String *)local_58);
  String::~String((String *)&stripped._data.ref);
  return;
}

Assistant:

void testStripComments()
{
  String input("{\n  \"test\": \"/*\",\n  /*\n*/\n  //\n  //a\n}\n");
  String stripped = Json::stripComments(input);
  String check("{\n  \"test\": \"/*\",\n  \n\n  \n  \n}\n");
  ASSERT(stripped == check);
}